

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

BCReg rec_mm_prep(jit_State *J,ASMFunction cont)

{
  TRef *pTVar1;
  TRef TVar2;
  ulong uVar3;
  BCReg BVar4;
  
  if (cont == lj_cont_cat) {
    BVar4 = J->maxslot;
  }
  else {
    BVar4 = (BCReg)*(byte *)(*(long *)((J->L->base[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
  }
  TVar2 = lj_ir_k64(J,IR_KNUM,(uint64_t)cont);
  pTVar1 = J->base;
  pTVar1[BVar4] = TVar2;
  pTVar1[BVar4 + 1] = 0x20000;
  J->framedepth = J->framedepth + 1;
  for (uVar3 = (ulong)J->maxslot; uVar3 < BVar4; uVar3 = uVar3 + 1) {
    pTVar1[uVar3] = 0;
  }
  return BVar4 + 2;
}

Assistant:

static BCReg rec_mm_prep(jit_State *J, ASMFunction cont)
{
  BCReg s, top = cont == lj_cont_cat ? J->maxslot : curr_proto(J->L)->framesize;
#if LJ_FR2
  J->base[top] = lj_ir_k64(J, IR_KNUM, u64ptr(contptr(cont)));
  J->base[top+1] = TREF_CONT;
#else
  J->base[top] = lj_ir_kptr(J, contptr(cont)) | TREF_CONT;
#endif
  J->framedepth++;
  for (s = J->maxslot; s < top; s++)
    J->base[s] = 0;  /* Clear frame gap to avoid resurrecting previous refs. */
  return top+1+LJ_FR2;
}